

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall
wabt::interp::Thread::DoSimdLoadSplat<wabt::interp::Simd<unsigned_int,(unsigned_char)4>>
          (Thread *this,Instr instr,Ptr *out_trap)

{
  RunResult RVar1;
  long lVar2;
  L val;
  Simd<unsigned_int,_(unsigned_char)__x04_> result;
  
  RVar1 = Load<unsigned_int>(this,instr,&val,out_trap);
  if (RVar1 == Ok) {
    for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 4) {
      *(L *)((long)result.v + lVar2) = val;
    }
    Push(this,(Value)result.v);
    RVar1 = Ok;
  }
  else {
    RVar1 = Trap;
  }
  return RVar1;
}

Assistant:

RunResult Thread::DoSimdLoadSplat(Instr instr, Trap::Ptr* out_trap) {
  using L = typename S::LaneType;
  L val;
  if (Load<L>(instr, &val, out_trap) != RunResult::Ok) {
    return RunResult::Trap;
  }
  S result;
  std::fill(std::begin(result.v), std::end(result.v), val);
  Push(result);
  return RunResult::Ok;
}